

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

Wlc_Ntk_t * Wlc_NtkMemBlast(Wlc_Ntk_t *p)

{
  int iVar1;
  Vec_Int_t *vFanins_00;
  Wlc_Ntk_t *pNew_00;
  Wlc_Obj_t *pWVar2;
  Wlc_Obj_t *pObj_00;
  Vec_Int_t *pVVar3;
  char *pcVar4;
  int local_2c;
  int i;
  Vec_Int_t *vFanins;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *pNew;
  Wlc_Ntk_t *p_local;
  
  Wlc_NtkCleanCopy(p);
  vFanins_00 = Vec_IntAlloc(100);
  pNew_00 = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  pNew_00->fSmtLib = p->fSmtLib;
  pNew_00->fAsyncRst = p->fAsyncRst;
  pNew_00->fMemPorts = p->fMemPorts;
  pNew_00->fEasyFfs = p->fEasyFfs;
  for (local_2c = 0; iVar1 = Wlc_NtkCiNum(p), local_2c < iVar1; local_2c = local_2c + 1) {
    pWVar2 = Wlc_NtkCi(p,local_2c);
    iVar1 = Wlc_ObjId(p,pWVar2);
    Wlc_ObjDup(pNew_00,p,iVar1,vFanins_00);
  }
  for (local_2c = 0; iVar1 = Wlc_NtkCoNum(p), local_2c < iVar1; local_2c = local_2c + 1) {
    pWVar2 = Wlc_NtkCo(p,local_2c);
    iVar1 = Wlc_ObjId(p,pWVar2);
    Wlc_NtkMemBlast_rec(pNew_00,p,iVar1,vFanins_00);
  }
  for (local_2c = 0; iVar1 = Wlc_NtkCoNum(p), local_2c < iVar1; local_2c = local_2c + 1) {
    pWVar2 = Wlc_NtkCo(p,local_2c);
    pObj_00 = Wlc_ObjCopyObj(pNew_00,p,pWVar2);
    Wlc_ObjSetCo(pNew_00,pObj_00,(uint)(*(ushort *)pWVar2 >> 10 & 1));
  }
  if (p->vInits != (Vec_Int_t *)0x0) {
    pVVar3 = Vec_IntDup(p->vInits);
    pNew_00->vInits = pVVar3;
  }
  if (p->pInits != (char *)0x0) {
    pcVar4 = Abc_UtilStrsav(p->pInits);
    pNew_00->pInits = pcVar4;
  }
  Vec_IntFree(vFanins_00);
  if (p->pSpec != (char *)0x0) {
    pcVar4 = Abc_UtilStrsav(p->pSpec);
    pNew_00->pSpec = pcVar4;
  }
  return pNew_00;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkMemBlast( Wlc_Ntk_t * p )
{
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    Vec_Int_t * vFanins;
    int i;
    Wlc_NtkCleanCopy( p );
    vFanins = Vec_IntAlloc( 100 );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    pNew->fSmtLib = p->fSmtLib;
    pNew->fAsyncRst = p->fAsyncRst;
    pNew->fMemPorts = p->fMemPorts;
    pNew->fEasyFfs = p->fEasyFfs;
    Wlc_NtkForEachCi( p, pObj, i )
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    Wlc_NtkForEachCo( p, pObj, i )
        Wlc_NtkMemBlast_rec( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    Wlc_NtkForEachCo( p, pObj, i )
        Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, pObj), pObj->fIsFi );
    if ( p->vInits )
    pNew->vInits = Vec_IntDup( p->vInits );
    if ( p->pInits )
    pNew->pInits = Abc_UtilStrsav( p->pInits );
    Vec_IntFree( vFanins );
    if ( p->pSpec )
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    return pNew;
}